

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile.c
# Opt level: O0

void big_array_iter_advance(BigArrayIter *iter)

{
  BigArray *pBVar1;
  int iVar2;
  int local_1c;
  int k;
  BigArray *array;
  BigArrayIter *iter_local;
  
  pBVar1 = iter->array;
  if (iter->contiguous == 0) {
    iVar2 = pBVar1->ndim + -1;
    iter->pos[iVar2] = iter->pos[iVar2] + 1;
    iter->dataptr = (void *)((long)iter->dataptr + pBVar1->strides[pBVar1->ndim + -1]);
    local_1c = pBVar1->ndim;
    while ((iVar2 = local_1c, local_1c = iVar2 + -1, -1 < local_1c &&
           (iter->pos[local_1c] == pBVar1->dims[local_1c]))) {
      iter->dataptr =
           (void *)((long)iter->dataptr - pBVar1->strides[local_1c] * iter->pos[local_1c]);
      iter->pos[local_1c] = 0;
      if (0 < local_1c) {
        iter->pos[iVar2 + -2] = iter->pos[iVar2 + -2] + 1;
        iter->dataptr = (void *)((long)iter->dataptr + pBVar1->strides[iVar2 + -2]);
      }
    }
  }
  else {
    iter->dataptr = (void *)((long)iter->dataptr + pBVar1->strides[pBVar1->ndim + -1]);
  }
  return;
}

Assistant:

void
big_array_iter_advance(BigArrayIter * iter)
{
    BigArray * array = iter->array;

    if(iter->contiguous) {
        iter->dataptr = (char*) iter->dataptr + array->strides[array->ndim - 1];
        return;
    }
    int k;
    iter->pos[array->ndim - 1] ++;
    iter->dataptr = ((char*) iter->dataptr) + array->strides[array->ndim - 1];
    for(k = array->ndim - 1; k >= 0; k --) {
        if(iter->pos[k] == array->dims[k]) {
            iter->dataptr = ((char*) iter->dataptr) - array->strides[k] * iter->pos[k];
            iter->pos[k] = 0;
            if(k > 0) {
                iter->pos[k - 1] ++;
                iter->dataptr = ((char*) iter->dataptr) + array->strides[k - 1];
            }
        } else {
            break;
        }
    }
}